

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int renameResolveTrigger(Parse *pParse,char *zDb)

{
  sqlite3 *db;
  Trigger *pTVar1;
  Db *pDVar2;
  char *zName;
  TriggerStep *pTVar3;
  anon_union_8_3_1bb8468b_for_uNC aVar4;
  int iVar5;
  int iVar6;
  Table *pTVar7;
  Upsert *pUpsert;
  TriggerStep **ppTVar8;
  NameContext local_e0;
  SrcList sSrc;
  
  db = pParse->db;
  pTVar1 = pParse->pNewTrigger;
  local_e0._40_8_ = 0;
  local_e0.pWinSelect = (Select *)0x0;
  local_e0.pNext = (NameContext *)0x0;
  local_e0.nRef = 0;
  local_e0.nErr = 0;
  local_e0.pSrcList = (SrcList *)0x0;
  local_e0.uNC.pEList = (ExprList *)0x0;
  pDVar2 = db->aDb;
  zName = pTVar1->table;
  local_e0.pParse = pParse;
  iVar5 = sqlite3SchemaToIndex(db,pTVar1->pTabSchema);
  pTVar7 = sqlite3FindTable(db,zName,pDVar2[iVar5].zDbSName);
  pParse->pTriggerTab = pTVar7;
  pParse->eTriggerOp = pTVar1->op;
  if (pTVar7 != (Table *)0x0) {
    iVar6 = sqlite3ViewGetColumnNames(pParse,pTVar7);
    iVar5 = 1;
    if (iVar6 != 0) goto LAB_001ad236;
  }
  if (pTVar1->pWhen == (Expr *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = sqlite3ResolveExprNames(&local_e0,pTVar1->pWhen);
  }
LAB_001ad236:
  ppTVar8 = &pTVar1->step_list;
  do {
    if ((iVar5 != 0) || (pTVar3 = *ppTVar8, pTVar3 == (TriggerStep *)0x0)) {
      return iVar5;
    }
    if (pTVar3->pSelect == (Select *)0x0) {
LAB_001ad27b:
      if (pTVar3->zTarget == (char *)0x0) {
        iVar5 = 0;
      }
      else {
        pTVar7 = sqlite3LocateTable(pParse,0,pTVar3->zTarget,zDb);
        iVar5 = 1;
        if (pTVar7 != (Table *)0x0) {
          iVar6 = sqlite3ViewGetColumnNames(pParse,pTVar7);
          iVar5 = 1;
          if (iVar6 == 0) {
            sSrc.a[0].pSchema = (Schema *)0x0;
            sSrc.a[0].colUsed = 0;
            sSrc.a[0].u1.zIndexedBy = (char *)0x0;
            sSrc.a[0].pOn = (Expr *)0x0;
            sSrc.a[0].pUsing = (IdList *)0x0;
            sSrc.a[0].regResult = 0;
            sSrc.a[0].fg = (anon_struct_4_7_7ffbf296_for_fg)0x0;
            sSrc.a[0].iCursor = 0;
            sSrc.a[0]._68_4_ = 0;
            sSrc.a[0].pSelect = (Select *)0x0;
            sSrc.a[0].addrFillSub = 0;
            sSrc.a[0].regReturn = 0;
            sSrc.a[0].zAlias = (char *)0x0;
            sSrc.a[0].pIBIndex = (Index *)0x0;
            sSrc.a[0].zDatabase = (char *)0x0;
            sSrc.nSrc = 1;
            sSrc.nAlloc = 0;
            sSrc.a[0].zName = pTVar3->zTarget;
            local_e0.pSrcList = &sSrc;
            sSrc.a[0].pTab = pTVar7;
            if (pTVar3->pWhere == (Expr *)0x0) {
LAB_001ad32b:
              iVar5 = sqlite3ResolveExprListNames(&local_e0,pTVar3->pExprList);
            }
            else {
              iVar6 = sqlite3ResolveExprNames(&local_e0,pTVar3->pWhere);
              iVar5 = 1;
              if (iVar6 == 0) goto LAB_001ad32b;
            }
            aVar4 = (anon_union_8_3_1bb8468b_for_uNC)pTVar3->pUpsert;
            if ((Upsert *)aVar4.pEList != (Upsert *)0x0) {
              (aVar4.pUpsert)->pUpsertSrc = &sSrc;
              local_e0.ncFlags = 0x200;
              local_e0.uNC = aVar4;
              iVar5 = sqlite3ResolveExprListNames(&local_e0,(aVar4.pUpsert)->pUpsertTarget);
              if (iVar5 == 0) {
                iVar5 = sqlite3ResolveExprListNames(&local_e0,(aVar4.pUpsert)->pUpsertSet);
                if (iVar5 == 0) {
                  iVar6 = sqlite3ResolveExprNames(&local_e0,(Expr *)(aVar4.pEList)->a[0].zSpan);
                  iVar5 = 1;
                  if (iVar6 == 0) {
                    iVar5 = sqlite3ResolveExprNames(&local_e0,(aVar4.pEList)->a[0].pExpr);
                  }
                }
              }
              local_e0._40_8_ = local_e0._40_8_ & 0xffffffff00000000;
            }
            local_e0.pSrcList = (SrcList *)0x0;
          }
        }
      }
    }
    else {
      sqlite3SelectPrep(pParse,pTVar3->pSelect,&local_e0);
      if ((pParse->nErr == 0) || (iVar5 = pParse->rc, iVar5 == 0)) goto LAB_001ad27b;
    }
    ppTVar8 = &pTVar3->pNext;
  } while( true );
}

Assistant:

static int renameResolveTrigger(Parse *pParse, const char *zDb){
  sqlite3 *db = pParse->db;
  Trigger *pNew = pParse->pNewTrigger;
  TriggerStep *pStep;
  NameContext sNC;
  int rc = SQLITE_OK;

  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  assert( pNew->pTabSchema );
  pParse->pTriggerTab = sqlite3FindTable(db, pNew->table, 
      db->aDb[sqlite3SchemaToIndex(db, pNew->pTabSchema)].zDbSName
  );
  pParse->eTriggerOp = pNew->op;
  /* ALWAYS() because if the table of the trigger does not exist, the
  ** error would have been hit before this point */
  if( ALWAYS(pParse->pTriggerTab) ){
    rc = sqlite3ViewGetColumnNames(pParse, pParse->pTriggerTab);
  }

  /* Resolve symbols in WHEN clause */
  if( rc==SQLITE_OK && pNew->pWhen ){
    rc = sqlite3ResolveExprNames(&sNC, pNew->pWhen);
  }

  for(pStep=pNew->step_list; rc==SQLITE_OK && pStep; pStep=pStep->pNext){
    if( pStep->pSelect ){
      sqlite3SelectPrep(pParse, pStep->pSelect, &sNC);
      if( pParse->nErr ) rc = pParse->rc;
    }
    if( rc==SQLITE_OK && pStep->zTarget ){
      Table *pTarget = sqlite3LocateTable(pParse, 0, pStep->zTarget, zDb);
      if( pTarget==0 ){
        rc = SQLITE_ERROR;
      }else if( SQLITE_OK==(rc = sqlite3ViewGetColumnNames(pParse, pTarget)) ){
        SrcList sSrc;
        memset(&sSrc, 0, sizeof(sSrc));
        sSrc.nSrc = 1;
        sSrc.a[0].zName = pStep->zTarget;
        sSrc.a[0].pTab = pTarget;
        sNC.pSrcList = &sSrc;
        if( pStep->pWhere ){
          rc = sqlite3ResolveExprNames(&sNC, pStep->pWhere);
        }
        if( rc==SQLITE_OK ){
          rc = sqlite3ResolveExprListNames(&sNC, pStep->pExprList);
        }
        assert( !pStep->pUpsert || (!pStep->pWhere && !pStep->pExprList) );
        if( pStep->pUpsert ){
          Upsert *pUpsert = pStep->pUpsert;
          assert( rc==SQLITE_OK );
          pUpsert->pUpsertSrc = &sSrc;
          sNC.uNC.pUpsert = pUpsert;
          sNC.ncFlags = NC_UUpsert;
          rc = sqlite3ResolveExprListNames(&sNC, pUpsert->pUpsertTarget);
          if( rc==SQLITE_OK ){
            ExprList *pUpsertSet = pUpsert->pUpsertSet;
            rc = sqlite3ResolveExprListNames(&sNC, pUpsertSet);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertWhere);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertTargetWhere);
          }
          sNC.ncFlags = 0;
        }
        sNC.pSrcList = 0;
      }
    }
  }
  return rc;
}